

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::ProcessBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *hash;
  int iVar2;
  _Base_ptr p_Var3;
  uchar *puVar4;
  CBlockIndex *pCVar5;
  _Base_ptr p_Var6;
  long in_FS_OFFSET;
  base_uint<256U> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 == (_Base_ptr)0x0) {
LAB_001d742d:
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5bf,
                  "void (anonymous namespace)::PeerManagerImpl::ProcessBlockAvailability(NodeId)");
  }
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var1->_M_header;
  do {
    if (nodeid <= *(long *)(p_Var3 + 1)) {
      p_Var6 = p_Var3;
    }
    p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < nodeid];
  } while (p_Var3 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)p_Var6 == p_Var1) || (nodeid < *(long *)(p_Var6 + 1))) goto LAB_001d742d;
  hash = &p_Var6[1]._M_left;
  puVar4 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (hash,&p_Var6[2]._M_left);
  if ((_Base_ptr *)puVar4 == &p_Var6[2]._M_left) goto LAB_001d7411;
  pCVar5 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,(uint256 *)hash);
  if (pCVar5 == (CBlockIndex *)0x0) goto LAB_001d7411;
  local_48.pn[4] = 0;
  local_48.pn[5] = 0;
  local_48.pn[6] = 0;
  local_48.pn[7] = 0;
  local_48.pn[0] = 0;
  local_48.pn[1] = 0;
  local_48.pn[2] = 0;
  local_48.pn[3] = 0;
  iVar2 = base_uint<256U>::CompareTo(&(pCVar5->nChainWork).super_base_uint<256U>,&local_48);
  if (iVar2 < 1) goto LAB_001d7411;
  if (p_Var6[1]._M_parent == (_Base_ptr)0x0) {
LAB_001d7402:
    p_Var6[1]._M_parent = (_Base_ptr)pCVar5;
  }
  else {
    iVar2 = base_uint<256U>::CompareTo
                      (&(pCVar5->nChainWork).super_base_uint<256U>,
                       (base_uint<256U> *)&p_Var6[1]._M_parent[1]._M_parent);
    if (-1 < iVar2) goto LAB_001d7402;
  }
  *(undefined8 *)(p_Var6 + 2) = 0;
  p_Var6[2]._M_parent = (_Base_ptr)0x0;
  *hash = (_Base_ptr)0x0;
  p_Var6[1]._M_right = (_Base_ptr)0x0;
LAB_001d7411:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessBlockAvailability(NodeId nodeid) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (!state->hashLastUnknownBlock.IsNull()) {
        const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(state->hashLastUnknownBlock);
        if (pindex && pindex->nChainWork > 0) {
            if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
                state->pindexBestKnownBlock = pindex;
            }
            state->hashLastUnknownBlock.SetNull();
        }
    }
}